

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void P_PlayerOnSpecial3DFloor(player_t *player)

{
  double dVar1;
  double dVar2;
  APlayerPawn *pAVar3;
  extsector_t *peVar4;
  undefined8 *puVar5;
  double *pdVar6;
  int floorType;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  pAVar3 = player->mo;
  peVar4 = ((pAVar3->super_AActor).Sector)->e;
  uVar7 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  if (uVar7 != 0) {
    lVar8 = 0;
    do {
      puVar5 = *(undefined8 **)
                ((long)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array + lVar8);
      if ((*(uint *)(puVar5 + 0xb) & 0x200001) == 1) {
        pdVar6 = (double *)puVar5[5];
        if ((*(uint *)(puVar5 + 0xb) & 2) == 0) {
          dVar1 = (pAVar3->super_AActor).__Pos.Z;
          dVar9 = (pAVar3->super_AActor).__Pos.X;
          dVar2 = (pAVar3->super_AActor).__Pos.Y;
          if ((dVar1 <= pdVar6[4] * (pdVar6[1] * dVar2 + pdVar6[3] + *pdVar6 * dVar9)) &&
             (pdVar6 = (double *)*puVar5,
             (dVar2 * pdVar6[1] + dVar9 * *pdVar6 + pdVar6[3]) * pdVar6[4] <=
             dVar1 + (pAVar3->super_AActor).Height)) {
LAB_004cecb7:
            P_PlayerInSpecialSector(player,(sector_t *)puVar5[0xd]);
            floorType = sector_t::GetTerrain((sector_t *)puVar5[0xd],*(int *)(puVar5 + 8));
            P_PlayerOnSpecialFlat(player,floorType);
            return;
          }
        }
        else {
          dVar1 = (pAVar3->super_AActor).__Pos.Z;
          dVar9 = pdVar6[4] *
                  (pdVar6[1] * (pAVar3->super_AActor).__Pos.Y +
                  pdVar6[3] + *pdVar6 * (pAVar3->super_AActor).__Pos.X);
          if ((dVar1 == dVar9) && (!NAN(dVar1) && !NAN(dVar9))) goto LAB_004cecb7;
        }
      }
      lVar8 = lVar8 + 8;
    } while (uVar7 << 3 != lVar8);
  }
  return;
}

Assistant:

void P_PlayerOnSpecial3DFloor(player_t* player)
{
	for(auto rover : player->mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;
		if (rover->flags & FF_FIX) continue;

		// Check the 3D floor's type...
		if(rover->flags & FF_SOLID)
		{
			// Player must be on top of the floor to be affected...
			if(player->mo->Z() != rover->top.plane->ZatPoint(player->mo)) continue;
		}
		else
		{
			//Water and DEATH FOG!!! heh
			if (player->mo->Z() > rover->top.plane->ZatPoint(player->mo) || 
				player->mo->Top() < rover->bottom.plane->ZatPoint(player->mo))
				continue;
		}

		// Apply sector specials
		P_PlayerInSpecialSector(player, rover->model);

		// Apply flat specials (using the ceiling!)
		P_PlayerOnSpecialFlat(
			player, rover->model->GetTerrain(rover->top.isceiling));

		break;
	}
}